

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O1

void __thiscall PrimeExtractor::iterateVector(PrimeExtractor *this,long step)

{
  ulong *puVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  p_Var3 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var4 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar5 = this->lastStep;
  while (uVar5 = uVar5 + step, uVar5 < (ulong)uVar2 + ((long)p_Var4 - (long)p_Var3) * 8) {
    uVar7 = uVar5 + 0x3f;
    if (-1 < (long)uVar5) {
      uVar7 = uVar5;
    }
    bVar6 = (byte)uVar5 & 0x3f;
    puVar1 = p_Var3 + ((long)uVar7 >> 6) +
                      (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff;
    *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
  }
  return;
}

Assistant:

void PrimeExtractor::iterateVector(long step)
{
  for(long i = this->lastStep + step; i < this->primeCand.size(); i = i + step) {
    this->primeCand[i] = false;
  }
  
}